

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCheck.h
# Opt level: O0

string * __thiscall
cppqc::CompactCheck<C_A_T_C_H_T_E_S_T_0()::$_0,void,void,bool>::name_abi_cxx11_
          (CompactCheck<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_philipp_classen[P]CppQuickCheck_test_compact_check_tests_cpp:37:39),_void,_void,_bool>
           *this)

{
  ulong uVar1;
  long in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x10));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"no-name",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

std::string name() const override {
    return m_name.empty() ? "no-name" : m_name;
  }